

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O1

target_ulong helper_4xx_tlbre_lo_ppc64(CPUPPCState_conflict2 *env,target_ulong entry)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = (uint)entry & 0x3f;
  uVar1 = (env->tlb).tlbe[uVar2].prot << 7;
  return (ulong)(uVar1 & 0x100) | (ulong)(uVar1 & 0x200) | (env->tlb).tlbe[uVar2].RPN;
}

Assistant:

target_ulong helper_4xx_tlbre_lo(CPUPPCState *env, target_ulong entry)
{
    ppcemb_tlb_t *tlb;
    target_ulong ret;

    entry &= PPC4XX_TLB_ENTRY_MASK;
    tlb = &env->tlb.tlbe[entry];
    ret = tlb->RPN;
    if (tlb->prot & PAGE_EXEC) {
        ret |= PPC4XX_TLBLO_EX;
    }
    if (tlb->prot & PAGE_WRITE) {
        ret |= PPC4XX_TLBLO_WR;
    }
    return ret;
}